

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip,mz_uint64 cur_file_ofs,mz_uint32 n)

{
  size_t sVar1;
  size_t __n;
  size_t sVar2;
  char buf [4096];
  undefined1 auStack_1038 [4104];
  
  __n = 0x1000;
  if (n < 0x1000) {
    __n = (size_t)n;
  }
  memset(auStack_1038,0,__n);
  if (n != 0) {
    do {
      sVar2 = 0x1000;
      if (n < 0x1000) {
        sVar2 = (size_t)n;
      }
      sVar1 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,cur_file_ofs,auStack_1038,sVar2);
      if (sVar1 != sVar2) {
        pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
        return 0;
      }
      cur_file_ofs = cur_file_ofs + sVar2;
      n = n - (int)sVar2;
    } while (n != 0);
  }
  return 1;
}

Assistant:

static mz_bool mz_zip_writer_write_zeros(mz_zip_archive *pZip, mz_uint64 cur_file_ofs, mz_uint32 n)
{
    char buf[4096];
    memset(buf, 0, MZ_MIN(sizeof(buf), n));
    while (n)
    {
        mz_uint32 s = MZ_MIN(sizeof(buf), n);
        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_file_ofs, buf, s) != s)
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

        cur_file_ofs += s;
        n -= s;
    }
    return MZ_TRUE;
}